

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * Extra_bddCreateExor(DdManager *dd,int nVars)

{
  DdNode *pDVar1;
  int i;
  DdNode *f;
  
  pDVar1 = Cudd_ReadLogicZero(dd);
  Cudd_Ref(pDVar1);
  if (0 < nVars) {
    i = 0;
    f = pDVar1;
    do {
      pDVar1 = Cudd_bddIthVar(dd,i);
      pDVar1 = Cudd_bddXor(dd,f,pDVar1);
      Cudd_Ref(pDVar1);
      Cudd_RecursiveDeref(dd,f);
      i = i + 1;
      f = pDVar1;
    } while (nVars != i);
  }
  Cudd_Deref(pDVar1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddCreateExor( DdManager * dd, int nVars )
{
    DdNode * bFunc, * bTemp;
    int i;
    bFunc = Cudd_ReadLogicZero(dd); Cudd_Ref( bFunc );
    for ( i = 0; i < nVars; i++ )
    {
        bFunc = Cudd_bddXor( dd, bTemp = bFunc, Cudd_bddIthVar(dd,i) );  Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bFunc );
    return bFunc;
}